

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

void __thiscall helics::RerouteFilterOperation::RerouteFilterOperation(RerouteFilterOperation *this)

{
  shared_guarded<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
  *in_RDI;
  shared_guarded<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
  *__args;
  
  __args = in_RDI;
  FilterOperations::FilterOperations((FilterOperations *)in_RDI);
  *(undefined ***)&(in_RDI->m_obj)._M_t._M_impl = &PTR__RerouteFilterOperation_009507d8;
  std::
  make_shared<helics::MessageDestOperator,helics::RerouteFilterOperation::RerouteFilterOperation()::__0>
            ((anon_class_8_1_8991fb9c *)__args);
  gmlc::libguarded::
  atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
  ::atomic_guarded<>((atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
                      *)in_RDI);
  gmlc::libguarded::
  shared_guarded<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
  ::shared_guarded<>(in_RDI);
  return;
}

Assistant:

RerouteFilterOperation::RerouteFilterOperation():
    op(std::make_shared<MessageDestOperator>(
        [this](const std::string& src, const std::string& dest) {
            return rerouteOperation(src, dest);
        }))
{
}